

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Fts5Structure * fts5StructureRead(Fts5Index *p)

{
  u8 *puVar1;
  int iVar2;
  Fts5Config *pConfig;
  u8 *puVar3;
  uint *puVar4;
  ulong uVar5;
  u32 uVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  i64 iVar12;
  Fts5Data *p_00;
  Fts5Structure *pFVar13;
  Fts5StructureSegment *pFVar14;
  ulong uVar15;
  int iVar16;
  Fts5StructureLevel *v;
  ulong uVar17;
  uint uVar18;
  u32 *v_00;
  int iVar19;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  u32 *v_01;
  long in_FS_OFFSET;
  bool bVar23;
  uint local_c4;
  ulong local_a0;
  u32 local_48;
  u32 local_44;
  int nLevel;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (p->pStruct != (Fts5Structure *)0x0) goto LAB_001c739e;
  iVar12 = fts5IndexDataVersion(p);
  p->iStructVersion = iVar12;
  if (p->rc != 0) goto LAB_001c739e;
  pConfig = p->pConfig;
  p_00 = fts5DataRead(p,10);
  if (p->rc == 0) {
    puVar3 = p_00->p;
    iVar2 = p_00->nn;
    puVar1 = puVar3 + iVar2;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    puVar1[8] = '\0';
    puVar1[9] = '\0';
    puVar1[10] = '\0';
    puVar1[0xb] = '\0';
    puVar1[0xc] = '\0';
    puVar1[0xd] = '\0';
    puVar1[0xe] = '\0';
    puVar1[0xf] = '\0';
    puVar3 = puVar3 + (long)iVar2 + 0x10;
    puVar3[0] = '\0';
    puVar3[1] = '\0';
    puVar3[2] = '\0';
    puVar3[3] = '\0';
    puVar4 = (uint *)p_00->p;
    iVar2 = p_00->nn;
    local_3c = 0;
    nLevel = 0;
    local_44 = 0;
    bVar23 = puVar4[1] == 0x10000ff;
    uVar18 = *puVar4;
    iVar9 = sqlite3Fts5GetVarint32((uchar *)(puVar4 + (ulong)bVar23 + 1),(u32 *)&nLevel);
    iVar10 = sqlite3Fts5GetVarint32
                       ((uchar *)((ulong)(iVar9 + (uint)bVar23 * 4 + 4) + (long)puVar4),&local_44);
    iVar16 = nLevel;
    uVar6 = local_44;
    uVar21 = (ulong)nLevel;
    iVar11 = 0x10b;
    if (local_44 < 0x7d1 && uVar21 < 0x7d1) {
      local_c4 = local_44;
      pFVar13 = (Fts5Structure *)sqlite3Fts5MallocZero(&local_3c,(uVar21 - 1) * 0x10 + 0x30);
      iVar19 = local_3c;
      if (pFVar13 == (Fts5Structure *)0x0) {
        p->rc = local_3c;
        if (local_3c == 0) goto LAB_001c73f7;
        pFVar13 = (Fts5Structure *)0x0;
      }
      else {
        uVar22 = iVar10 + 4 + iVar9 + (uint)bVar23 * 4;
        pFVar13->nRef = 1;
        pFVar13->nLevel = iVar16;
        pFVar13->nSegment = uVar6;
        bVar7 = sqlite3Fts5GetVarint
                          ((uchar *)((ulong)uVar22 + (long)puVar4),&pFVar13->nWriteCounter);
        iVar16 = bVar7 + uVar22;
        local_a0 = 0;
        for (uVar17 = 0; (iVar19 == 0 && (uVar17 < uVar21)); uVar17 = uVar17 + 1) {
          local_48 = 0;
          if (iVar16 < iVar2) {
            v = pFVar13->aLevel + uVar17;
            iVar11 = sqlite3Fts5GetVarint32((uchar *)((long)iVar16 + (long)puVar4),(u32 *)v);
            iVar9 = sqlite3Fts5GetVarint32
                              ((uchar *)((long)(iVar11 + iVar16) + (long)puVar4),&local_48);
            uVar6 = local_48;
            if ((int)local_48 < v->nMerge) {
              local_3c = 0x10b;
            }
            iVar16 = iVar11 + iVar16 + iVar9;
            pFVar14 = (Fts5StructureSegment *)
                      sqlite3Fts5MallocZero(&local_3c,(long)(int)local_48 * 0x38);
            v->aSeg = pFVar14;
            local_c4 = local_c4 - uVar6;
            iVar19 = local_3c;
            if (local_3c == 0) {
              uVar15 = 0;
              if (0 < (int)uVar6) {
                uVar15 = (ulong)uVar6;
              }
              v->nSeg = uVar6;
              lVar20 = 0;
              do {
                if (uVar15 * 0x38 + 0x38 == lVar20 + 0x38) {
                  iVar19 = 0;
                  goto LAB_001c72cd;
                }
                if (iVar2 <= iVar16) break;
                pFVar14 = v->aSeg;
                iVar11 = sqlite3Fts5GetVarint32
                                   ((uchar *)((long)iVar16 + (long)puVar4),
                                    (u32 *)((long)&pFVar14->iSegid + lVar20));
                v_00 = (u32 *)((long)&pFVar14->pgnoFirst + lVar20);
                iVar9 = sqlite3Fts5GetVarint32
                                  ((uchar *)((long)(iVar11 + iVar16) + (long)puVar4),v_00);
                iVar9 = iVar11 + iVar16 + iVar9;
                v_01 = (u32 *)((long)&pFVar14->pgnoLast + lVar20);
                iVar16 = sqlite3Fts5GetVarint32((uchar *)((long)puVar4 + (long)iVar9),v_01);
                iVar16 = iVar9 + iVar16;
                if (bVar23) {
                  bVar7 = sqlite3Fts5GetVarint
                                    ((uchar *)((long)puVar4 + (long)iVar16),
                                     (u64 *)((long)&pFVar14->iOrigin1 + lVar20));
                  bVar8 = sqlite3Fts5GetVarint
                                    ((uchar *)((long)puVar4 + (long)(int)(iVar16 + (uint)bVar7)),
                                     (u64 *)((long)&pFVar14->iOrigin2 + lVar20));
                  iVar16 = iVar16 + (uint)bVar7 + (uint)bVar8;
                  iVar11 = sqlite3Fts5GetVarint32
                                     ((uchar *)((long)puVar4 + (long)iVar16),
                                      (u32 *)((long)&pFVar14->nPgTombstone + lVar20));
                  iVar16 = iVar16 + iVar11;
                  bVar7 = sqlite3Fts5GetVarint
                                    ((uchar *)((long)puVar4 + (long)iVar16),
                                     (u64 *)((long)&pFVar14->nEntryTombstone + lVar20));
                  iVar16 = iVar16 + (uint)bVar7;
                  bVar7 = sqlite3Fts5GetVarint
                                    ((uchar *)((long)puVar4 + (long)iVar16),
                                     (u64 *)((long)&pFVar14->nEntry + lVar20));
                  iVar16 = iVar16 + (uint)bVar7;
                  uVar5 = *(ulong *)((long)&pFVar14->iOrigin2 + lVar20);
                  if (local_a0 <= uVar5) {
                    local_a0 = uVar5;
                  }
                }
                lVar20 = lVar20 + 0x38;
              } while ((int)*v_00 <= (int)*v_01);
              local_3c = 0x10b;
              iVar19 = 0x10b;
LAB_001c72cd:
              if (((uVar17 != 0) && (uVar6 == 0)) && ((int)*(u64 *)(v + -1) != 0)) {
                local_3c = 0x10b;
                iVar19 = 0x10b;
              }
              if ((uVar17 == (uVar21 - 1 & 0xffffffff)) && (v->nMerge != 0)) {
                local_3c = 0x10b;
                iVar19 = 0x10b;
              }
            }
          }
          else {
            local_3c = 0x10b;
            iVar19 = 0x10b;
          }
        }
        iVar11 = 0x10b;
        if (local_c4 == 0) {
          iVar11 = iVar19;
        }
        if (iVar19 != 0) {
          iVar11 = iVar19;
        }
        if (bVar23) {
          pFVar13->nOriginCntr = local_a0 + 1;
        }
        if (iVar11 != 0) {
          fts5StructureRelease(pFVar13);
          goto LAB_001c736e;
        }
        p->rc = 0;
LAB_001c73f7:
        uVar18 = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18
        ;
        if ((pConfig->pgsz == 0) || (pConfig->iCookie != uVar18)) {
          iVar11 = sqlite3Fts5ConfigLoad(pConfig,uVar18);
          goto LAB_001c737b;
        }
      }
    }
    else {
LAB_001c736e:
      pFVar13 = (Fts5Structure *)0x0;
LAB_001c737b:
      p->rc = iVar11;
    }
    sqlite3_free(p_00);
    if (p->rc != 0) {
      fts5StructureRelease(pFVar13);
      goto LAB_001c7394;
    }
  }
  else {
LAB_001c7394:
    pFVar13 = (Fts5Structure *)0x0;
  }
  p->pStruct = pFVar13;
LAB_001c739e:
  if (p->rc == 0) {
    pFVar13 = p->pStruct;
    pFVar13->nRef = pFVar13->nRef + 1;
  }
  else {
    pFVar13 = (Fts5Structure *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pFVar13;
}

Assistant:

static Fts5Structure *fts5StructureRead(Fts5Index *p){

  if( p->pStruct==0 ){
    p->iStructVersion = fts5IndexDataVersion(p);
    if( p->rc==SQLITE_OK ){
      p->pStruct = fts5StructureReadUncached(p);
    }
  }

#if 0
  else{
    Fts5Structure *pTest = fts5StructureReadUncached(p);
    if( pTest ){
      int i, j;
      assert_nc( p->pStruct->nSegment==pTest->nSegment );
      assert_nc( p->pStruct->nLevel==pTest->nLevel );
      for(i=0; i<pTest->nLevel; i++){
        assert_nc( p->pStruct->aLevel[i].nMerge==pTest->aLevel[i].nMerge );
        assert_nc( p->pStruct->aLevel[i].nSeg==pTest->aLevel[i].nSeg );
        for(j=0; j<pTest->aLevel[i].nSeg; j++){
          Fts5StructureSegment *p1 = &pTest->aLevel[i].aSeg[j];
          Fts5StructureSegment *p2 = &p->pStruct->aLevel[i].aSeg[j];
          assert_nc( p1->iSegid==p2->iSegid );
          assert_nc( p1->pgnoFirst==p2->pgnoFirst );
          assert_nc( p1->pgnoLast==p2->pgnoLast );
        }
      }
      fts5StructureRelease(pTest);
    }
  }
#endif

  if( p->rc!=SQLITE_OK ) return 0;
  assert( p->iStructVersion!=0 );
  assert( p->pStruct!=0 );
  fts5StructureRef(p->pStruct);
  return p->pStruct;
}